

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

void andyzip::brotli_decoder::inverse_move_to_front(uint8_t *values,int num_values)

{
  byte bVar1;
  uint8_t uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t local_108 [264];
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    local_108[lVar3] = (uint8_t)lVar3;
  }
  uVar4 = 0;
  uVar5 = (ulong)(uint)num_values;
  if (num_values < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    bVar1 = values[uVar4];
    uVar2 = local_108[bVar1];
    values[uVar4] = uVar2;
    uVar6 = (ulong)bVar1;
    while (uVar6 != 0) {
      local_108[uVar6] = local_108[(int)uVar6 - 1];
      uVar6 = uVar6 - 1;
    }
    local_108[0] = uVar2;
  }
  return;
}

Assistant:

static void inverse_move_to_front(uint8_t values[], int num_values) {
      uint8_t mtf[256];
      for (int i = 0; i < 256; ++i) {
        mtf[i] = (uint8_t)i;
      }
      for (int i = 0; i < num_values; ++i) {
        uint8_t index = values[i];
        uint8_t value = mtf[index];
        values[i] = value;
        for (; index; --index) {
          mtf[index] = mtf[index - 1];
        }
        mtf[0] = value;
      }
    }